

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slapack_lite.c
# Opt level: O1

int spotf2_(char *uplo,integer *n,real *a,integer *lda,integer *info)

{
  int iVar1;
  bool bVar2;
  logical lVar3;
  integer iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  doublereal dVar8;
  integer i__2;
  int local_50;
  real r__1;
  integer i__3;
  int local_44;
  double local_40;
  integer *local_38;
  
  iVar1 = *lda;
  *info = 0;
  spotf2_::upper = lsame_(uplo,"U");
  if ((spotf2_::upper == 0) && (lVar3 = lsame_(uplo,"L"), lVar3 == 0)) {
    iVar4 = -1;
  }
  else {
    iVar5 = *n;
    if (iVar5 < 0) {
      iVar4 = -2;
    }
    else {
      iVar6 = 1;
      if (1 < iVar5) {
        iVar6 = iVar5;
      }
      iVar4 = -4;
      if (iVar6 <= *lda) goto LAB_001163ff;
    }
  }
  *info = iVar4;
LAB_001163ff:
  if (*info == 0) {
    local_44 = *n;
    if (local_44 != 0) {
      uVar7 = ~(long)iVar1;
      local_38 = info;
      if (spotf2_::upper == 0) {
        spotf2_::j = 1;
        if (0 < local_44) {
          local_50 = iVar1 + 1;
          do {
            i__2 = spotf2_::j + -1;
            local_40 = (double)a[uVar7 + (long)(spotf2_::j * local_50)];
            dVar8 = sdot_(&i__2,a + uVar7 + (long)(spotf2_::j + iVar1),lda,
                          a + uVar7 + (long)(spotf2_::j + iVar1),lda);
            spotf2_::ajj = (real)(local_40 - dVar8);
            if (spotf2_::ajj <= 0.0) goto LAB_00116784;
            if (spotf2_::ajj < 0.0) {
              spotf2_::ajj = sqrtf(spotf2_::ajj);
            }
            else {
              spotf2_::ajj = SQRT(spotf2_::ajj);
            }
            iVar4 = spotf2_::j;
            a[uVar7 + (long)(spotf2_::j * local_50)] = spotf2_::ajj;
            i__2 = *n - iVar4;
            if (i__2 != 0 && iVar4 <= *n) {
              i__3 = iVar4 + -1;
              sgemv_("No transpose",&i__2,&i__3,&c_b181,a + uVar7 + (long)(iVar4 + iVar1 + 1),lda,
                     a + uVar7 + (long)(iVar4 + iVar1),lda,&c_b164,
                     a + uVar7 + (long)(iVar4 + iVar4 * iVar1 + 1),&c__1);
              i__2 = *n - spotf2_::j;
              r__1 = 1.0 / spotf2_::ajj;
              sscal_(&i__2,&r__1,a + uVar7 + (long)(spotf2_::j * iVar1 + spotf2_::j + 1),&c__1);
            }
            iVar5 = spotf2_::j + 1;
            bVar2 = spotf2_::j < local_44;
            spotf2_::j = iVar5;
          } while (bVar2);
        }
      }
      else {
        spotf2_::j = 1;
        if (0 < local_44) {
          local_50 = iVar1 + 1;
          do {
            i__2 = spotf2_::j + -1;
            local_40 = (double)a[uVar7 + (long)(spotf2_::j + spotf2_::j * iVar1)];
            dVar8 = sdot_(&i__2,a + uVar7 + (long)(spotf2_::j * iVar1) + 1,&c__1,
                          a + uVar7 + (long)(spotf2_::j * iVar1) + 1,&c__1);
            spotf2_::ajj = (real)(local_40 - dVar8);
            if (spotf2_::ajj <= 0.0) {
LAB_00116784:
              a[uVar7 + (long)(local_50 * spotf2_::j)] = spotf2_::ajj;
              *local_38 = spotf2_::j;
              return 0;
            }
            if (spotf2_::ajj < 0.0) {
              spotf2_::ajj = sqrtf(spotf2_::ajj);
            }
            else {
              spotf2_::ajj = SQRT(spotf2_::ajj);
            }
            iVar4 = spotf2_::j;
            a[uVar7 + (long)(spotf2_::j * local_50)] = spotf2_::ajj;
            iVar5 = *n - iVar4;
            if (iVar5 != 0 && iVar4 <= *n) {
              i__2 = iVar4 + -1;
              iVar6 = (iVar4 + 1) * iVar1;
              i__3 = iVar5;
              sgemv_("Transpose",&i__2,&i__3,&c_b181,a + uVar7 + (long)iVar6 + 1,lda,
                     a + uVar7 + (long)(iVar4 * iVar1) + 1,&c__1,&c_b164,
                     a + uVar7 + (long)(iVar6 + iVar4),lda);
              i__2 = *n - spotf2_::j;
              r__1 = 1.0 / spotf2_::ajj;
              sscal_(&i__2,&r__1,a + uVar7 + (long)((spotf2_::j + 1) * iVar1 + spotf2_::j),lda);
            }
            iVar5 = spotf2_::j + 1;
            bVar2 = spotf2_::j < local_44;
            spotf2_::j = iVar5;
          } while (bVar2);
        }
      }
    }
  }
  else {
    local_44 = -*info;
    xerbla_("SPOTF2",&local_44);
  }
  return 0;
}

Assistant:

int spotf2_(char *uplo, integer *n, real *a, integer *lda,
	integer *info)
{
    /* System generated locals */
    integer a_dim1, a_offset, i__1, i__2, i__3;
    real r__1;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    static integer j;
    static real ajj;
    extern doublereal sdot_(integer *, real *, integer *, real *, integer *);
    extern logical lsame_(char *, char *);
    extern /* Subroutine */ int sscal_(integer *, real *, real *, integer *),
	    sgemv_(char *, integer *, integer *, real *, real *, integer *,
	    real *, integer *, real *, real *, integer *);
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    -- LAPACK routine (version 3.0) --
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,
       Courant Institute, Argonne National Lab, and Rice University
       February 29, 1992


    Purpose
    =======

    SPOTF2 computes the Cholesky factorization of a real symmetric
    positive definite matrix A.

    The factorization has the form
       A = U' * U ,  if UPLO = 'U', or
       A = L  * L',  if UPLO = 'L',
    where U is an upper triangular matrix and L is lower triangular.

    This is the unblocked version of the algorithm, calling Level 2 BLAS.

    Arguments
    =========

    UPLO    (input) CHARACTER*1
            Specifies whether the upper or lower triangular part of the
            symmetric matrix A is stored.
            = 'U':  Upper triangular
            = 'L':  Lower triangular

    N       (input) INTEGER
            The order of the matrix A.  N >= 0.

    A       (input/output) REAL array, dimension (LDA,N)
            On entry, the symmetric matrix A.  If UPLO = 'U', the leading
            n by n upper triangular part of A contains the upper
            triangular part of the matrix A, and the strictly lower
            triangular part of A is not referenced.  If UPLO = 'L', the
            leading n by n lower triangular part of A contains the lower
            triangular part of the matrix A, and the strictly upper
            triangular part of A is not referenced.

            On exit, if INFO = 0, the factor U or L from the Cholesky
            factorization A = U'*U  or A = L*L'.

    LDA     (input) INTEGER
            The leading dimension of the array A.  LDA >= max(1,N).

    INFO    (output) INTEGER
            = 0: successful exit
            < 0: if INFO = -k, the k-th argument had an illegal value
            > 0: if INFO = k, the leading minor of order k is not
                 positive definite, and the factorization could not be
                 completed.

    =====================================================================


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;

    /* Function Body */
    *info = 0;
    upper = lsame_(uplo, "U");
    if (! upper && ! lsame_(uplo, "L")) {
	*info = -1;
    } else if (*n < 0) {
	*info = -2;
    } else if (*lda < max(1,*n)) {
	*info = -4;
    }
    if (*info != 0) {
	i__1 = -(*info);
	xerbla_("SPOTF2", &i__1);
	return 0;
    }

/*     Quick return if possible */

    if (*n == 0) {
	return 0;
    }

    if (upper) {

/*        Compute the Cholesky factorization A = U'*U. */

	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {

/*           Compute U(J,J) and test for non-positive-definiteness. */

	    i__2 = j - 1;
	    ajj = a[j + j * a_dim1] - sdot_(&i__2, &a[j * a_dim1 + 1], &c__1,
		    &a[j * a_dim1 + 1], &c__1);
	    if (ajj <= 0.f) {
		a[j + j * a_dim1] = ajj;
		goto L30;
	    }
	    ajj = sqrt(ajj);
	    a[j + j * a_dim1] = ajj;

/*           Compute elements J+1:N of row J. */

	    if (j < *n) {
		i__2 = j - 1;
		i__3 = *n - j;
		sgemv_("Transpose", &i__2, &i__3, &c_b181, &a[(j + 1) *
			a_dim1 + 1], lda, &a[j * a_dim1 + 1], &c__1, &c_b164,
			&a[j + (j + 1) * a_dim1], lda);
		i__2 = *n - j;
		r__1 = 1.f / ajj;
		sscal_(&i__2, &r__1, &a[j + (j + 1) * a_dim1], lda);
	    }
/* L10: */
	}
    } else {

/*        Compute the Cholesky factorization A = L*L'. */

	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {

/*           Compute L(J,J) and test for non-positive-definiteness. */

	    i__2 = j - 1;
	    ajj = a[j + j * a_dim1] - sdot_(&i__2, &a[j + a_dim1], lda, &a[j
		    + a_dim1], lda);
	    if (ajj <= 0.f) {
		a[j + j * a_dim1] = ajj;
		goto L30;
	    }
	    ajj = sqrt(ajj);
	    a[j + j * a_dim1] = ajj;

/*           Compute elements J+1:N of column J. */

	    if (j < *n) {
		i__2 = *n - j;
		i__3 = j - 1;
		sgemv_("No transpose", &i__2, &i__3, &c_b181, &a[j + 1 +
			a_dim1], lda, &a[j + a_dim1], lda, &c_b164, &a[j + 1
			+ j * a_dim1], &c__1);
		i__2 = *n - j;
		r__1 = 1.f / ajj;
		sscal_(&i__2, &r__1, &a[j + 1 + j * a_dim1], &c__1);
	    }
/* L20: */
	}
    }
    goto L40;

L30:
    *info = j;

L40:
    return 0;

/*     End of SPOTF2 */

}